

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::section::Type<27>>::
Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Base<njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::section::Type<27>> *this,
          StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  long *in_R9;
  
  read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((map<int,_njoy::ENDFtk::section::Type<27>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<27>_>_>_>
              *)this,(Base<njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::section::Type<27>> *)division,
             (StructureDivision *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,in_R9);
  return;
}

Assistant:

Base( StructureDivision& division,
      Iterator& begin, const Iterator& end, long& lineNumber )
  try: sections_( read( division, begin, end, lineNumber ) ) {}
  catch ( std::exception& e ) {

    Log::info("Encountered error while reading file::Type<{}>", this->MF() );
    Log::info( "Line number: {}", lineNumber );
    throw e;
  }